

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_R_PDU.cpp
# Opt level: O1

void __thiscall KDIS::PDU::Record_R_PDU::Encode(Record_R_PDU *this,KDataStream *stream)

{
  pointer pRVar1;
  pointer pRVar2;
  KDataStream KStack_48;
  
  Simulation_Management_Header::Encode((Simulation_Management_Header *)this,stream);
  KDataStream::Write<unsigned_int>(stream,(this->super_Set_Record_R_PDU).m_ui32RqId);
  KDataStream::Write(stream,(this->super_Set_Record_R_PDU).super_Reliability_Header.m_ui8ReqRelSrv);
  KDataStream::Write(stream,(this->super_Set_Record_R_PDU).super_Simulation_Management_Header.
                            super_Header.super_Header6.m_ui8Padding2);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16EvntTyp);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32SrlNm);
  KDataStream::Write<unsigned_int>(stream,(this->super_Set_Record_R_PDU).m_ui32NumRecSets);
  pRVar1 = (this->super_Set_Record_R_PDU).m_vRecs.
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar2 = (this->super_Set_Record_R_PDU).m_vRecs.
                super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar2 != pRVar1; pRVar2 = pRVar2 + 1) {
    (*(pRVar2->super_DataTypeBase)._vptr_DataTypeBase[4])(&KStack_48,pRVar2);
    KDataStream::operator<<(stream,&KStack_48);
    KDataStream::~KDataStream(&KStack_48);
  }
  return;
}

Assistant:

void Record_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << m_ui32RqId
           << m_ui8ReqRelSrv
           << m_ui8Padding2
           << m_ui16EvntTyp
           << m_ui32SrlNm
           << m_ui32NumRecSets;

    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << citr->Encode();
    }
}